

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryBuffer.cpp
# Opt level: O2

unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>
llvm::MemoryBuffer::getMemBufferCopy(StringRef InputData,Twine *BufferName)

{
  error_category *peVar1;
  storage_type *psVar2;
  Twine *in_RCX;
  WritableMemoryBuffer *pWVar3;
  error_code EC;
  undefined1 local_48 [8];
  ErrorOr<std::unique_ptr<llvm::WritableMemoryBuffer,_std::default_delete<llvm::WritableMemoryBuffer>_>_>
  Buf;
  
  WritableMemoryBuffer::getNewUninitMemBuffer
            ((WritableMemoryBuffer *)&Buf.field_0x10,(size_t)BufferName,in_RCX);
  if (Buf._16_8_ == 0) {
    peVar1 = (error_category *)std::_V2::generic_category();
    EC._M_cat = peVar1;
    EC._0_8_ = 0xc;
    ErrorOr<std::unique_ptr<llvm::WritableMemoryBuffer,_std::default_delete<llvm::WritableMemoryBuffer>_>_>
    ::ErrorOr((ErrorOr<std::unique_ptr<llvm::WritableMemoryBuffer,_std::default_delete<llvm::WritableMemoryBuffer>_>_>
               *)local_48,EC);
  }
  else {
    memcpy(*(void **)(Buf._16_8_ + 8),(void *)InputData.Length,(size_t)BufferName);
    ErrorOr<std::unique_ptr<llvm::WritableMemoryBuffer,std::default_delete<llvm::WritableMemoryBuffer>>>
    ::
    ErrorOr<std::unique_ptr<llvm::WritableMemoryBuffer,std::default_delete<llvm::WritableMemoryBuffer>>>
              ((ErrorOr<std::unique_ptr<llvm::WritableMemoryBuffer,std::default_delete<llvm::WritableMemoryBuffer>>>
                *)local_48,
               (unique_ptr<llvm::WritableMemoryBuffer,_std::default_delete<llvm::WritableMemoryBuffer>_>
                *)&Buf.field_0x10,(type *)0x0);
    if (Buf._16_8_ != 0) {
      (**(code **)(*(long *)Buf._16_8_ + 8))();
    }
  }
  if ((Buf.field_0.ErrorStorage.buffer[8] & 1U) == 0) {
    psVar2 = ErrorOr<std::unique_ptr<llvm::WritableMemoryBuffer,_std::default_delete<llvm::WritableMemoryBuffer>_>_>
             ::getStorage((ErrorOr<std::unique_ptr<llvm::WritableMemoryBuffer,_std::default_delete<llvm::WritableMemoryBuffer>_>_>
                           *)local_48);
    pWVar3 = (psVar2->_M_t).
             super___uniq_ptr_impl<llvm::WritableMemoryBuffer,_std::default_delete<llvm::WritableMemoryBuffer>_>
             ._M_t.
             super__Tuple_impl<0UL,_llvm::WritableMemoryBuffer_*,_std::default_delete<llvm::WritableMemoryBuffer>_>
             .super__Head_base<0UL,_llvm::WritableMemoryBuffer_*,_false>._M_head_impl;
    (psVar2->_M_t).
    super___uniq_ptr_impl<llvm::WritableMemoryBuffer,_std::default_delete<llvm::WritableMemoryBuffer>_>
    ._M_t.
    super__Tuple_impl<0UL,_llvm::WritableMemoryBuffer_*,_std::default_delete<llvm::WritableMemoryBuffer>_>
    .super__Head_base<0UL,_llvm::WritableMemoryBuffer_*,_false>._M_head_impl =
         (WritableMemoryBuffer *)0x0;
  }
  else {
    pWVar3 = (WritableMemoryBuffer *)0x0;
  }
  *(WritableMemoryBuffer **)InputData.Data = pWVar3;
  ErrorOr<std::unique_ptr<llvm::WritableMemoryBuffer,_std::default_delete<llvm::WritableMemoryBuffer>_>_>
  ::~ErrorOr((ErrorOr<std::unique_ptr<llvm::WritableMemoryBuffer,_std::default_delete<llvm::WritableMemoryBuffer>_>_>
              *)local_48);
  return (__uniq_ptr_data<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>,_true,_true>)
         (tuple<llvm::MemoryBuffer_*,_std::default_delete<llvm::MemoryBuffer>_>)InputData.Data;
}

Assistant:

std::unique_ptr<MemoryBuffer>
MemoryBuffer::getMemBufferCopy(StringRef InputData, const Twine &BufferName) {
  auto Buf = getMemBufferCopyImpl(InputData, BufferName);
  if (Buf)
    return std::move(*Buf);
  return nullptr;
}